

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O3

void __thiscall
pbrt::PiecewiseLinear2D<0UL>::PiecewiseLinear2D
          (PiecewiseLinear2D<0UL> *this,memory_resource *alloc,long data,uint xSize,int ySize,
          char param_6,char param_7)

{
  float fVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined8 uVar21;
  byte bVar22;
  byte bVar23;
  long lVar24;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this_00;
  long lVar25;
  uint uVar26;
  long lVar27;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  float *pfVar34;
  ushort uVar35;
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  float fVar42;
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_68;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *local_48;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *local_40;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *local_38;
  ulong n;
  
  auVar44 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
  (this->m_size).super_Tuple2<pbrt::Vector2,_int>.x = xSize;
  local_38 = &this->m_data;
  (this->m_size).super_Tuple2<pbrt::Vector2,_int>.y = ySize;
  auVar45 = vpinsrd_avx(ZEXT416(xSize),ySize,1);
  local_40 = &this->m_marginal_cdf;
  auVar44 = vpaddd_avx(auVar45,auVar44);
  auVar45._8_4_ = 0x3f800000;
  auVar45._0_8_ = 0x3f8000003f800000;
  auVar45._12_4_ = 0x3f800000;
  local_48 = &this->m_conditional_cdf;
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar45 = vdivps_avx(auVar45,auVar44);
  auVar44 = vmovlhps_avx(auVar45,auVar44);
  this->m_patch_size = (Vector2f)auVar44._0_8_;
  this->m_inv_patch_size = (Vector2f)auVar44._8_8_;
  auVar44 = ZEXT816(0) << 0x20;
  (this->m_param_values).alloc.memoryResource = alloc;
  (this->m_param_values).nStored = 0;
  (this->m_param_values).ptr =
       (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)auVar44._0_8_;
  (this->m_param_values).nAlloc = auVar44._8_8_;
  (this->m_data).alloc.memoryResource = alloc;
  (this->m_data).ptr = (float *)auVar44._0_8_;
  (this->m_data).nAlloc = auVar44._8_8_;
  (this->m_data).nStored = 0;
  (this->m_marginal_cdf).alloc.memoryResource = alloc;
  (this->m_marginal_cdf).ptr = (float *)auVar44._0_8_;
  (this->m_marginal_cdf).nAlloc = auVar44._8_8_;
  (this->m_marginal_cdf).nStored = 0;
  (this->m_conditional_cdf).alloc.memoryResource = alloc;
  (this->m_conditional_cdf).ptr = (float *)auVar44._0_8_;
  (this->m_conditional_cdf).nAlloc = auVar44._8_8_;
  (this->m_conditional_cdf).nStored = 0;
  if (param_7 == '\x01' && param_6 == '\0') {
    LogFatal(Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling.h"
             ,0x589,"PiecewiseLinear2D: build_cdf implies normalize=true");
  }
  uVar26 = ySize * xSize;
  n = (ulong)uVar26;
  local_68.alloc.memoryResource = pstd::pmr::new_delete_resource();
  local_68.nStored = 0;
  local_68.ptr = (float *)0x0;
  local_68.nAlloc = 0;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::reserve(&local_68,n);
  if (n != 0) {
    memset(local_68.ptr,0,n * 4);
  }
  local_68.nStored = n;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=(local_38,&local_68);
  local_68.nStored = 0;
  (*(local_68.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_68.alloc.memoryResource,local_68.ptr,local_68.nAlloc << 2);
  if (param_7 == '\0') {
    if (param_6 == '\0') {
      fVar42 = 1.0 / ((this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.x *
                     (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.y);
    }
    else {
      uVar28 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.y - 1;
      if (uVar28 == 0) {
        dVar43 = 0.0;
      }
      else {
        iVar3 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.x;
        dVar43 = 0.0;
        uVar30 = 0;
        uVar31 = 0;
        do {
          if (iVar3 != 1) {
            pfVar5 = (float *)(data + (ulong)((int)uVar31 * xSize) * 4);
            fVar42 = pfVar5[(int)xSize];
            lVar25 = 1;
            fVar48 = *pfVar5;
            do {
              fVar1 = *(float *)(data + uVar30 * 4 + lVar25 * 4);
              fVar48 = fVar48 + fVar1 + fVar42;
              fVar42 = *(float *)(data + (long)(int)xSize * 4 + uVar30 * 4 + lVar25 * 4);
              lVar25 = lVar25 + 1;
              dVar43 = dVar43 + (double)((fVar48 + fVar42) * 0.25);
              fVar48 = fVar1;
            } while (iVar3 != (int)lVar25);
          }
          uVar31 = uVar31 + 1;
          uVar30 = (ulong)((int)uVar30 + xSize);
        } while (uVar31 != uVar28);
      }
      fVar42 = (float)(1.0 / dVar43);
    }
    if (uVar26 != 0) {
      pfVar5 = (this->m_data).ptr;
      uVar30 = 0;
      do {
        pfVar5[uVar30] = fVar42 * *(float *)(data + uVar30 * 4);
        uVar30 = uVar30 + 1;
      } while (n != uVar30);
    }
  }
  else {
    uVar30 = (ulong)(uint)(this->m_size).super_Tuple2<pbrt::Vector2,_int>.y;
    local_68.alloc.memoryResource = pstd::pmr::new_delete_resource();
    local_68.nStored = 0;
    local_68.ptr = (float *)0x0;
    local_68.nAlloc = 0;
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::reserve(&local_68,uVar30);
    if (uVar30 != 0) {
      memset(local_68.ptr,0,uVar30 * 4);
    }
    local_68.nStored = uVar30;
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=(local_40,&local_68);
    local_68.nStored = 0;
    (*(local_68.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_68.alloc.memoryResource,local_68.ptr,local_68.nAlloc << 2,4);
    this_00 = local_48;
    local_68.alloc.memoryResource = pstd::pmr::new_delete_resource();
    local_68.nStored = 0;
    local_68.ptr = (float *)0x0;
    local_68.nAlloc = 0;
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::reserve(&local_68,n);
    if (uVar26 != 0) {
      memset(local_68.ptr,0,n * 4);
    }
    local_68.nStored = n;
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=(this_00,&local_68);
    local_68.nStored = 0;
    (*(local_68.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_68.alloc.memoryResource,local_68.ptr,local_68.nAlloc << 2,4);
    iVar3 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.y;
    lVar25 = (long)iVar3;
    pfVar5 = (this->m_marginal_cdf).ptr;
    pfVar6 = (this->m_conditional_cdf).ptr;
    pfVar7 = (this->m_data).ptr;
    if (lVar25 < 1) {
      *pfVar5 = 0.0;
    }
    else {
      iVar4 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.x;
      lVar29 = (long)(int)xSize;
      pfVar34 = pfVar6 + 1;
      lVar32 = 0;
      lVar33 = data;
      do {
        pfVar6[lVar32 * lVar29] = 0.0;
        if (1 < iVar4) {
          auVar44 = ZEXT816(0) << 0x40;
          lVar27 = 0;
          do {
            auVar2._8_8_ = 0;
            auVar2._0_8_ = *(ulong *)(lVar33 + lVar27 * 4);
            auVar45 = vcvtps2pd_avx(auVar2);
            auVar46._0_8_ = auVar45._0_8_ + auVar45._8_8_;
            auVar46._8_8_ = auVar45._0_8_ + auVar45._8_8_;
            auVar44 = vfmadd231sd_fma(auVar44,auVar46,ZEXT816(0x3fe0000000000000));
            pfVar34[lVar27] = (float)auVar44._0_8_;
            lVar27 = lVar27 + 1;
          } while (iVar4 + -1 != (int)lVar27);
        }
        lVar32 = lVar32 + 1;
        lVar33 = lVar33 + lVar29 * 4;
        pfVar34 = pfVar34 + lVar29;
      } while (lVar32 != lVar25);
      *pfVar5 = 0.0;
      if (1 < iVar3) {
        auVar44 = ZEXT816(0) << 0x40;
        lVar33 = -1;
        lVar32 = 0;
        do {
          lVar27 = lVar29 + lVar33;
          lVar24 = lVar29 * 2 + lVar33;
          lVar33 = lVar33 + lVar29;
          auVar47._8_8_ = 0;
          auVar47._0_8_ = (double)pfVar6[lVar27] + (double)pfVar6[lVar24];
          auVar44 = vfmadd231sd_fma(auVar44,auVar47,ZEXT816(0x3fe0000000000000));
          pfVar5[lVar32 + 1] = (float)auVar44._0_8_;
          lVar32 = lVar32 + 1;
        } while (iVar3 + -1 != lVar32);
      }
    }
    auVar44._0_4_ = 1.0 / pfVar5[iVar3 + -1];
    auVar44._4_12_ = SUB6012((undefined1  [60])0x0,0);
    if (uVar26 != 0) {
      auVar36 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar37 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar38 = vbroadcastss_avx512f(auVar44);
      auVar39 = vpbroadcastq_avx512f();
      uVar30 = 0;
      do {
        auVar40 = vpbroadcastq_avx512f();
        auVar41 = vporq_avx512f(auVar40,auVar36);
        auVar40 = vporq_avx512f(auVar40,auVar37);
        uVar21 = vpcmpuq_avx512f(auVar40,auVar39,2);
        bVar22 = (byte)uVar21;
        uVar21 = vpcmpuq_avx512f(auVar41,auVar39,2);
        bVar23 = (byte)uVar21;
        uVar35 = CONCAT11(bVar23,bVar22);
        pfVar34 = pfVar6 + uVar30;
        auVar40._4_4_ = (uint)((byte)(uVar35 >> 1) & 1) * (int)pfVar34[1];
        auVar40._0_4_ = (uint)(bVar22 & 1) * (int)*pfVar34;
        auVar40._8_4_ = (uint)((byte)(uVar35 >> 2) & 1) * (int)pfVar34[2];
        auVar40._12_4_ = (uint)((byte)(uVar35 >> 3) & 1) * (int)pfVar34[3];
        auVar40._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * (int)pfVar34[4];
        auVar40._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * (int)pfVar34[5];
        auVar40._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * (int)pfVar34[6];
        auVar40._28_4_ = (uint)((byte)(uVar35 >> 7) & 1) * (int)pfVar34[7];
        auVar40._32_4_ = (uint)(bVar23 & 1) * (int)pfVar34[8];
        auVar40._36_4_ = (uint)(bVar23 >> 1 & 1) * (int)pfVar34[9];
        auVar40._40_4_ = (uint)(bVar23 >> 2 & 1) * (int)pfVar34[10];
        auVar40._44_4_ = (uint)(bVar23 >> 3 & 1) * (int)pfVar34[0xb];
        auVar40._48_4_ = (uint)(bVar23 >> 4 & 1) * (int)pfVar34[0xc];
        auVar40._52_4_ = (uint)(bVar23 >> 5 & 1) * (int)pfVar34[0xd];
        auVar40._56_4_ = (uint)(bVar23 >> 6 & 1) * (int)pfVar34[0xe];
        auVar40._60_4_ = (uint)(bVar23 >> 7) * (int)pfVar34[0xf];
        auVar40 = vmulps_avx512f(auVar38,auVar40);
        pfVar34 = pfVar6 + uVar30;
        bVar8 = (bool)((byte)(uVar35 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar35 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar35 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar35 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar35 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar35 >> 6) & 1);
        bVar14 = (bool)((byte)(uVar35 >> 7) & 1);
        bVar15 = (bool)(bVar23 >> 1 & 1);
        bVar16 = (bool)(bVar23 >> 2 & 1);
        bVar17 = (bool)(bVar23 >> 3 & 1);
        bVar18 = (bool)(bVar23 >> 4 & 1);
        bVar19 = (bool)(bVar23 >> 5 & 1);
        bVar20 = (bool)(bVar23 >> 6 & 1);
        *pfVar34 = (float)((uint)(bVar22 & 1) * auVar40._0_4_ |
                          (uint)!(bool)(bVar22 & 1) * (int)*pfVar34);
        pfVar34[1] = (float)((uint)bVar8 * auVar40._4_4_ | (uint)!bVar8 * (int)pfVar34[1]);
        pfVar34[2] = (float)((uint)bVar9 * auVar40._8_4_ | (uint)!bVar9 * (int)pfVar34[2]);
        pfVar34[3] = (float)((uint)bVar10 * auVar40._12_4_ | (uint)!bVar10 * (int)pfVar34[3]);
        pfVar34[4] = (float)((uint)bVar11 * auVar40._16_4_ | (uint)!bVar11 * (int)pfVar34[4]);
        pfVar34[5] = (float)((uint)bVar12 * auVar40._20_4_ | (uint)!bVar12 * (int)pfVar34[5]);
        pfVar34[6] = (float)((uint)bVar13 * auVar40._24_4_ | (uint)!bVar13 * (int)pfVar34[6]);
        pfVar34[7] = (float)((uint)bVar14 * auVar40._28_4_ | (uint)!bVar14 * (int)pfVar34[7]);
        pfVar34[8] = (float)((uint)(bVar23 & 1) * auVar40._32_4_ |
                            (uint)!(bool)(bVar23 & 1) * (int)pfVar34[8]);
        pfVar34[9] = (float)((uint)bVar15 * auVar40._36_4_ | (uint)!bVar15 * (int)pfVar34[9]);
        pfVar34[10] = (float)((uint)bVar16 * auVar40._40_4_ | (uint)!bVar16 * (int)pfVar34[10]);
        pfVar34[0xb] = (float)((uint)bVar17 * auVar40._44_4_ | (uint)!bVar17 * (int)pfVar34[0xb]);
        pfVar34[0xc] = (float)((uint)bVar18 * auVar40._48_4_ | (uint)!bVar18 * (int)pfVar34[0xc]);
        pfVar34[0xd] = (float)((uint)bVar19 * auVar40._52_4_ | (uint)!bVar19 * (int)pfVar34[0xd]);
        pfVar34[0xe] = (float)((uint)bVar20 * auVar40._56_4_ | (uint)!bVar20 * (int)pfVar34[0xe]);
        pfVar34[0xf] = (float)((uint)(bVar23 >> 7) * auVar40._60_4_ |
                              (uint)!(bool)(bVar23 >> 7) * (int)pfVar34[0xf]);
        uVar30 = uVar30 + 0x10;
      } while ((n + 0xf & 0xfffffffffffffff0) != uVar30);
    }
    if (iVar3 != 0) {
      auVar36 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar37 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar38 = vbroadcastss_avx512f(auVar44);
      auVar39 = vpbroadcastq_avx512f();
      uVar30 = 0;
      do {
        auVar40 = vpbroadcastq_avx512f();
        auVar41 = vporq_avx512f(auVar40,auVar36);
        auVar40 = vporq_avx512f(auVar40,auVar37);
        uVar21 = vpcmpuq_avx512f(auVar40,auVar39,2);
        bVar22 = (byte)uVar21;
        uVar21 = vpcmpuq_avx512f(auVar41,auVar39,2);
        bVar23 = (byte)uVar21;
        uVar35 = CONCAT11(bVar23,bVar22);
        pfVar6 = pfVar5 + uVar30;
        auVar41._4_4_ = (uint)((byte)(uVar35 >> 1) & 1) * (int)pfVar6[1];
        auVar41._0_4_ = (uint)(bVar22 & 1) * (int)*pfVar6;
        auVar41._8_4_ = (uint)((byte)(uVar35 >> 2) & 1) * (int)pfVar6[2];
        auVar41._12_4_ = (uint)((byte)(uVar35 >> 3) & 1) * (int)pfVar6[3];
        auVar41._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * (int)pfVar6[4];
        auVar41._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * (int)pfVar6[5];
        auVar41._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * (int)pfVar6[6];
        auVar41._28_4_ = (uint)((byte)(uVar35 >> 7) & 1) * (int)pfVar6[7];
        auVar41._32_4_ = (uint)(bVar23 & 1) * (int)pfVar6[8];
        auVar41._36_4_ = (uint)(bVar23 >> 1 & 1) * (int)pfVar6[9];
        auVar41._40_4_ = (uint)(bVar23 >> 2 & 1) * (int)pfVar6[10];
        auVar41._44_4_ = (uint)(bVar23 >> 3 & 1) * (int)pfVar6[0xb];
        auVar41._48_4_ = (uint)(bVar23 >> 4 & 1) * (int)pfVar6[0xc];
        auVar41._52_4_ = (uint)(bVar23 >> 5 & 1) * (int)pfVar6[0xd];
        auVar41._56_4_ = (uint)(bVar23 >> 6 & 1) * (int)pfVar6[0xe];
        auVar41._60_4_ = (uint)(bVar23 >> 7) * (int)pfVar6[0xf];
        auVar40 = vmulps_avx512f(auVar38,auVar41);
        pfVar6 = pfVar5 + uVar30;
        bVar8 = (bool)((byte)(uVar35 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar35 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar35 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar35 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar35 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar35 >> 6) & 1);
        bVar14 = (bool)((byte)(uVar35 >> 7) & 1);
        bVar15 = (bool)(bVar23 >> 1 & 1);
        bVar16 = (bool)(bVar23 >> 2 & 1);
        bVar17 = (bool)(bVar23 >> 3 & 1);
        bVar18 = (bool)(bVar23 >> 4 & 1);
        bVar19 = (bool)(bVar23 >> 5 & 1);
        bVar20 = (bool)(bVar23 >> 6 & 1);
        *pfVar6 = (float)((uint)(bVar22 & 1) * auVar40._0_4_ |
                         (uint)!(bool)(bVar22 & 1) * (int)*pfVar6);
        pfVar6[1] = (float)((uint)bVar8 * auVar40._4_4_ | (uint)!bVar8 * (int)pfVar6[1]);
        pfVar6[2] = (float)((uint)bVar9 * auVar40._8_4_ | (uint)!bVar9 * (int)pfVar6[2]);
        pfVar6[3] = (float)((uint)bVar10 * auVar40._12_4_ | (uint)!bVar10 * (int)pfVar6[3]);
        pfVar6[4] = (float)((uint)bVar11 * auVar40._16_4_ | (uint)!bVar11 * (int)pfVar6[4]);
        pfVar6[5] = (float)((uint)bVar12 * auVar40._20_4_ | (uint)!bVar12 * (int)pfVar6[5]);
        pfVar6[6] = (float)((uint)bVar13 * auVar40._24_4_ | (uint)!bVar13 * (int)pfVar6[6]);
        pfVar6[7] = (float)((uint)bVar14 * auVar40._28_4_ | (uint)!bVar14 * (int)pfVar6[7]);
        pfVar6[8] = (float)((uint)(bVar23 & 1) * auVar40._32_4_ |
                           (uint)!(bool)(bVar23 & 1) * (int)pfVar6[8]);
        pfVar6[9] = (float)((uint)bVar15 * auVar40._36_4_ | (uint)!bVar15 * (int)pfVar6[9]);
        pfVar6[10] = (float)((uint)bVar16 * auVar40._40_4_ | (uint)!bVar16 * (int)pfVar6[10]);
        pfVar6[0xb] = (float)((uint)bVar17 * auVar40._44_4_ | (uint)!bVar17 * (int)pfVar6[0xb]);
        pfVar6[0xc] = (float)((uint)bVar18 * auVar40._48_4_ | (uint)!bVar18 * (int)pfVar6[0xc]);
        pfVar6[0xd] = (float)((uint)bVar19 * auVar40._52_4_ | (uint)!bVar19 * (int)pfVar6[0xd]);
        pfVar6[0xe] = (float)((uint)bVar20 * auVar40._56_4_ | (uint)!bVar20 * (int)pfVar6[0xe]);
        pfVar6[0xf] = (float)((uint)(bVar23 >> 7) * auVar40._60_4_ |
                             (uint)!(bool)(bVar23 >> 7) * (int)pfVar6[0xf]);
        uVar30 = uVar30 + 0x10;
      } while ((lVar25 + 0xfU & 0xfffffffffffffff0) != uVar30);
    }
    if (uVar26 != 0) {
      uVar30 = 0;
      do {
        pfVar7[uVar30] = auVar44._0_4_ * *(float *)(data + uVar30 * 4);
        uVar30 = uVar30 + 1;
      } while (n != uVar30);
    }
  }
  return;
}

Assistant:

PiecewiseLinear2D(Allocator alloc, const float *data, int xSize, int ySize,
                      pstd::array<int, Dimension> param_res = {},
                      pstd::array<const float *, Dimension> param_values = {},
                      bool normalize = true, bool build_cdf = true)
        : m_size(xSize, ySize),
          m_patch_size(1.f / (xSize - 1), 1.f / (ySize - 1)),
          m_inv_patch_size(m_size - Vector2i(1, 1)),
          m_param_values(alloc),
          m_data(alloc),
          m_marginal_cdf(alloc),
          m_conditional_cdf(alloc) {
        if (build_cdf && !normalize)
            LOG_FATAL("PiecewiseLinear2D: build_cdf implies normalize=true");

        /* Keep track of the dependence on additional parameters (optional) */
        uint32_t slices = 1;
        for (int i = 0; i < ArraySize; ++i)
            m_param_values.emplace_back(alloc);
        for (int i = (int)Dimension - 1; i >= 0; --i) {
            if (param_res[i] < 1)
                LOG_FATAL("PiecewiseLinear2D(): parameter resolution must be >= 1!");

            m_param_size[i] = param_res[i];
            m_param_values[i] = FloatStorage(param_res[i]);
            memcpy(m_param_values[i].data(), param_values[i],
                   sizeof(float) * param_res[i]);
            m_param_strides[i] = param_res[i] > 1 ? slices : 0;
            slices *= m_param_size[i];
        }

        uint32_t n_values = xSize * ySize;

        m_data = FloatStorage(slices * n_values);

        if (build_cdf) {
            m_marginal_cdf = FloatStorage(slices * m_size.y);
            m_conditional_cdf = FloatStorage(slices * n_values);

            float *marginal_cdf = m_marginal_cdf.data(),
                  *conditional_cdf = m_conditional_cdf.data(), *data_out = m_data.data();

            for (uint32_t slice = 0; slice < slices; ++slice) {
                /* Construct conditional CDF */
                for (int y = 0; y < m_size.y; ++y) {
                    double sum = 0.0;
                    size_t i = y * xSize;
                    conditional_cdf[i] = 0.f;
                    for (int x = 0; x < m_size.x - 1; ++x, ++i) {
                        sum += .5 * ((double)data[i] + (double)data[i + 1]);
                        conditional_cdf[i + 1] = (float)sum;
                    }
                }

                /* Construct marginal CDF */
                marginal_cdf[0] = 0.f;
                double sum = 0.0;
                for (int y = 0; y < m_size.y - 1; ++y) {
                    sum += .5 * ((double)conditional_cdf[(y + 1) * xSize - 1] +
                                 (double)conditional_cdf[(y + 2) * xSize - 1]);
                    marginal_cdf[y + 1] = (float)sum;
                }

                /* Normalize CDFs and PDF (if requested) */
                float normalization = 1.f / marginal_cdf[m_size.y - 1];
                for (size_t i = 0; i < n_values; ++i)
                    conditional_cdf[i] *= normalization;
                for (size_t i = 0; i < m_size.y; ++i)
                    marginal_cdf[i] *= normalization;
                for (size_t i = 0; i < n_values; ++i)
                    data_out[i] = data[i] * normalization;

                marginal_cdf += m_size.y;
                conditional_cdf += n_values;
                data_out += n_values;
                data += n_values;
            }
        } else {
            float *data_out = m_data.data();

            for (uint32_t slice = 0; slice < slices; ++slice) {
                float normalization = 1.f / HProd(m_inv_patch_size);
                if (normalize) {
                    double sum = 0.0;
                    for (uint32_t y = 0; y < m_size.y - 1; ++y) {
                        size_t i = y * xSize;
                        for (uint32_t x = 0; x < m_size.x - 1; ++x, ++i) {
                            float v00 = data[i], v10 = data[i + 1], v01 = data[i + xSize],
                                  v11 = data[i + 1 + xSize],
                                  avg = .25f * (v00 + v10 + v01 + v11);
                            sum += (double)avg;
                        }
                    }
                    normalization = float(1.0 / sum);
                }

                for (uint32_t k = 0; k < n_values; ++k)
                    data_out[k] = data[k] * normalization;

                data += n_values;
                data_out += n_values;
            }
        }
    }